

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

void caption_frame_init(caption_frame_t *frame)

{
  caption_frame_t *in_RDI;
  
  xds_init((xds_t *)0x104bc2);
  caption_frame_state_clear(in_RDI);
  caption_frame_buffer_clear((caption_frame_buffer_t *)0x104bdb);
  caption_frame_buffer_clear((caption_frame_buffer_t *)0x104be8);
  return;
}

Assistant:

void caption_frame_init(caption_frame_t* frame)
{
    xds_init(&frame->xds);
    caption_frame_state_clear(frame);
    caption_frame_buffer_clear(&frame->back);
    caption_frame_buffer_clear(&frame->front);
}